

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O2

int stbi_jpeg_test_file(FILE *f)

{
  int iVar1;
  long lVar2;
  jpeg j;
  
  lVar2 = ftell((FILE *)f);
  j.s.img_file = f;
  iVar1 = decode_jpeg_header(&j,1);
  fseek((FILE *)f,(long)(int)lVar2,0);
  return iVar1;
}

Assistant:

int stbi_jpeg_test_file(FILE *f)
{
   int n,r;
   jpeg j;
   n = ftell(f);
   start_file(&j.s, f);
   r = decode_jpeg_header(&j, SCAN_type);
   fseek(f,n,SEEK_SET);
   return r;
}